

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet_ntop.c
# Opt level: O2

char * ares_inet_ntop(int af,void *src,char *dst,ares_socklen_t size)

{
  uint *puVar1;
  int iVar2;
  char *pcVar3;
  int *piVar4;
  char *pcVar5;
  size_t sVar6;
  ulong uVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  char *dst_00;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint local_88 [8];
  char tmp [46];
  undefined1 local_3a [10];
  
  pcVar3 = (char *)(ulong)size;
  if (af == 10) {
    local_88[4] = 0;
    local_88[5] = 0;
    local_88[6] = 0;
    local_88[7] = 0;
    local_88[0] = 0;
    local_88[1] = 0;
    local_88[2] = 0;
    local_88[3] = 0;
    bVar8 = 0;
    for (uVar10 = 0; uVar10 != 0x10; uVar10 = uVar10 + 1) {
      puVar1 = (uint *)((long)local_88 + (uVar10 & 0xfffffffffffffffe) * 2);
      *puVar1 = *puVar1 | (uint)*(byte *)((long)src + uVar10) << (~bVar8 & 8);
      bVar8 = bVar8 + 8;
    }
    uVar10 = 0xffffffffffffffff;
    uVar9 = 0;
    uVar14 = uVar10;
    uVar11 = uVar10;
    uVar16 = 0;
    for (uVar13 = 0; uVar13 != 8; uVar13 = uVar13 + 1) {
      uVar7 = uVar14;
      uVar15 = uVar16;
      if (local_88[uVar13] == 0) {
        uVar9 = uVar9 + 1;
        uVar12 = uVar11;
        if (uVar11 == 0xffffffffffffffff) {
          uVar9 = 1;
          uVar12 = uVar13;
        }
      }
      else {
        uVar12 = uVar10;
        if ((uVar11 != 0xffffffffffffffff) &&
           (uVar7 = uVar11, uVar15 = uVar9, uVar9 <= uVar16 && uVar14 != 0xffffffffffffffff)) {
          uVar7 = uVar14;
          uVar15 = uVar16;
        }
      }
      uVar14 = uVar7;
      uVar11 = uVar12;
      uVar16 = uVar15;
    }
    if ((uVar11 != 0xffffffffffffffff) && (uVar16 < uVar9 || uVar14 == 0xffffffffffffffff)) {
      uVar14 = uVar11;
      uVar16 = uVar9;
    }
    uVar10 = 0xffffffffffffffff;
    if (1 < uVar16) {
      uVar10 = uVar14;
    }
    if (uVar14 == 0xffffffffffffffff) {
      uVar10 = uVar14;
    }
    dst_00 = tmp;
    for (uVar14 = 0; uVar14 != 8; uVar14 = uVar14 + 1) {
      if ((uVar14 < uVar10) || (uVar10 + uVar16 <= uVar14)) {
        if (uVar14 != 0) {
          *dst_00 = ':';
          dst_00 = dst_00 + 1;
          if ((uVar14 == 6 && uVar10 == 0) &&
             (((uVar16 == 6 || ((uVar16 == 7 && (local_88[7] != 1)))) ||
              ((uVar16 == 5 && (local_88[5] == 0xffff)))))) {
            pcVar5 = inet_ntop4((uchar *)((long)src + 0xc),dst_00,(size_t)(local_3a + -(long)dst_00)
                               );
            if (pcVar5 == (char *)0x0) {
              return (char *)0x0;
            }
            sVar6 = ares_strlen(dst_00);
            dst_00 = dst_00 + sVar6;
            break;
          }
        }
        iVar2 = snprintf(dst_00,(size_t)(local_3a + -(long)dst_00),"%x",(ulong)local_88[uVar14]);
        dst_00 = dst_00 + iVar2;
      }
      else if (uVar10 == uVar14) {
        *dst_00 = ':';
        dst_00 = dst_00 + 1;
      }
    }
    if ((uVar10 != 0xffffffffffffffff) && (uVar10 + uVar16 == 8)) {
      *dst_00 = ':';
      dst_00 = dst_00 + 1;
    }
    *dst_00 = '\0';
    if (dst_00 + (1 - (long)tmp) <= pcVar3) {
      ares_strcpy(dst,tmp,(size_t)pcVar3);
      return dst;
    }
    piVar4 = __errno_location();
    *piVar4 = 0x1c;
  }
  else {
    if (af == 2) {
      pcVar3 = inet_ntop4((uchar *)src,dst,(size_t)pcVar3);
      return pcVar3;
    }
    piVar4 = __errno_location();
    *piVar4 = 0x61;
  }
  return (char *)0x0;
}

Assistant:

const char        *ares_inet_ntop(int af, const void *src, char *dst,
                                  ares_socklen_t size)
{
  switch (af) {
    case AF_INET:
      return inet_ntop4(src, dst, (size_t)size);
    case AF_INET6:
      return inet_ntop6(src, dst, (size_t)size);
    default:
      break;
  }
  SET_SOCKERRNO(EAFNOSUPPORT);
  return NULL;
}